

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucky.c
# Opt level: O3

void swapInfoAdjacentVars(int iVar,char *pCanonPerm,uint *p_uCanonPhase)

{
  ushort *puVar1;
  uint uVar2;
  byte bVar3;
  
  puVar1 = (ushort *)(pCanonPerm + iVar);
  *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
  uVar2 = *p_uCanonPhase;
  bVar3 = (byte)iVar;
  if (((uVar2 >> (bVar3 + 1 & 0x1f) ^ uVar2 >> (bVar3 & 0x1f)) & 1) != 0) {
    *p_uCanonPhase = uVar2 ^ 3 << (bVar3 & 0x1f);
  }
  return;
}

Assistant:

void swapInfoAdjacentVars(int iVar, char * pCanonPerm, unsigned* p_uCanonPhase)
{
    char Temp = pCanonPerm[iVar];
    pCanonPerm[iVar] = pCanonPerm[iVar+1];
    pCanonPerm[iVar+1] = Temp;
    
    // if the polarity of variables is different, swap them
    if ( ((*p_uCanonPhase & (1 << iVar)) > 0) != ((*p_uCanonPhase & (1 << (iVar+1))) > 0) )
    {
        *p_uCanonPhase ^= (1 << iVar);
        *p_uCanonPhase ^= (1 << (iVar+1));
    }
            
}